

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Text_Display.cxx
# Opt level: O3

int __thiscall
Fl_Text_Display::position_style(Fl_Text_Display *this,int lineStartPos,int lineLen,int lineIndex)

{
  Fl_Text_Buffer *pFVar1;
  Fl_Text_Buffer *this_00;
  uint uVar2;
  uint uVar3;
  byte bVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  
  pFVar1 = this->mBuffer;
  uVar7 = 0x100;
  if (pFVar1 != (Fl_Text_Buffer *)0x0 && lineStartPos != -1) {
    iVar6 = lineLen;
    if (lineIndex < lineLen) {
      iVar6 = lineIndex;
    }
    iVar6 = iVar6 + lineStartPos;
    uVar7 = 0x100;
    if (lineIndex < lineLen) {
      this_00 = this->mStyleBuffer;
      if (this_00 == (Fl_Text_Buffer *)0x0) {
        uVar7 = 0;
      }
      else {
        bVar4 = Fl_Text_Buffer::byte_at(this_00,iVar6);
        uVar7 = (uint)bVar4;
        if (((uint)bVar4 == (int)this->mUnfinishedStyle) &&
           (uVar7 = (uint)bVar4, this->mUnfinishedHighlightCB != (Unfinished_Style_Cb)0x0)) {
          (*this->mUnfinishedHighlightCB)(iVar6,this->mHighlightCBArg);
          bVar4 = Fl_Text_Buffer::byte_at(this_00,iVar6);
          uVar7 = (uint)bVar4;
        }
      }
    }
    iVar5 = Fl_Text_Selection::includes(&pFVar1->mPrimary,iVar6);
    uVar2 = uVar7 + 0x400;
    if (iVar5 == 0) {
      uVar2 = uVar7;
    }
    iVar5 = Fl_Text_Selection::includes(&pFVar1->mHighlight,iVar6);
    uVar3 = uVar2 + 0x800;
    if (iVar5 == 0) {
      uVar3 = uVar2;
    }
    iVar6 = Fl_Text_Selection::includes(&pFVar1->mSecondary,iVar6);
    uVar7 = uVar3 + 0x200;
    if (iVar6 == 0) {
      uVar7 = uVar3;
    }
  }
  return uVar7;
}

Assistant:

int Fl_Text_Display::position_style( int lineStartPos, int lineLen, int lineIndex) const
{
  IS_UTF8_ALIGNED2(buffer(), lineStartPos)

  Fl_Text_Buffer * buf = mBuffer;
  Fl_Text_Buffer *styleBuf = mStyleBuffer;
  int pos, style = 0;

  if ( lineStartPos == -1 || buf == NULL )
    return FILL_MASK;

  pos = lineStartPos + min( lineIndex, lineLen );

  if ( lineIndex >= lineLen )
    style = FILL_MASK;
  else if ( styleBuf != NULL ) {
    style = ( unsigned char ) styleBuf->byte_at( pos );
    if (style == mUnfinishedStyle && mUnfinishedHighlightCB) {
      /* encountered "unfinished" style, trigger parsing */
      (mUnfinishedHighlightCB)( pos, mHighlightCBArg);
      style = (unsigned char) styleBuf->byte_at( pos);
    }
  }
  if (buf->primary_selection()->includes(pos))
    style |= PRIMARY_MASK;
  if (buf->highlight_selection()->includes(pos))
    style |= HIGHLIGHT_MASK;
  if (buf->secondary_selection()->includes(pos))
    style |= SECONDARY_MASK;
  return style;
}